

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_time.c
# Opt level: O3

uint64_t getRawTime(void)

{
  long lVar1;
  timespec ts;
  timespec local_18;
  
  if (_glfw.x11.timer.monotonic == '\0') {
    gettimeofday((timeval *)&local_18,(__timezone_ptr_t)0x0);
    lVar1 = local_18.tv_sec * 1000000;
  }
  else {
    clock_gettime(1,&local_18);
    lVar1 = local_18.tv_sec * 1000000000;
  }
  return lVar1 + local_18.tv_nsec;
}

Assistant:

static uint64_t getRawTime(void)
{
#if defined(CLOCK_MONOTONIC)
    if (_glfw.x11.timer.monotonic)
    {
        struct timespec ts;

        clock_gettime(CLOCK_MONOTONIC, &ts);
        return (uint64_t) ts.tv_sec * (uint64_t) 1000000000 + (uint64_t) ts.tv_nsec;
    }
    else
#endif
    {
        struct timeval tv;

        gettimeofday(&tv, NULL);
        return (uint64_t) tv.tv_sec * (uint64_t) 1000000 + (uint64_t) tv.tv_usec;
    }
}